

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O0

void sph_soln<FNV1A64x8>(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *keywords,vector<unsigned_char,_std::allocator<unsigned_char>_> *mixTable,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *permutedKeywords,
                        vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  size_type sVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  ulong uVar4;
  long lVar5;
  const_reference pvVar6;
  undefined8 uVar7;
  char *pcVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  uint8_t local_a3 [3];
  unsigned_long *local_a0;
  unsigned_long *local_98;
  uint64_t local_90 [4];
  undefined8 local_70;
  undefined8 local_68;
  string local_60 [8];
  string identifier;
  uint pk;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *permutedKeywords_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *mixTable_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keywords_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(permutedKeywords);
  printf("const char* Keyword[ %lu ] = { ",sVar1);
  cVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(permutedKeywords);
  cVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(permutedKeywords);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,sph_soln<FNV1A64x8>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Key,std::allocator<FNV1A64x8::Key>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Hash,std::allocator<FNV1A64x8::Hash>>const&)::_lambda(std::__cxx11::string)_1_>
            (cVar2._M_current,cVar3._M_current);
  printf("};\n");
  printf("enum Key { ");
  identifier.field_2._8_4_ = 0;
  while( true ) {
    uVar4 = (ulong)(uint)identifier.field_2._8_4_;
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(permutedKeywords);
    if (sVar1 <= uVar4) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](permutedKeywords,(ulong)(uint)identifier.field_2._8_4_);
    lVar5 = std::__cxx11::string::length();
    if (lVar5 != 0) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](permutedKeywords,(ulong)(uint)identifier.field_2._8_4_);
      std::__cxx11::string::string(local_60,(string *)pvVar6);
      local_68 = std::__cxx11::string::begin();
      local_70 = std::__cxx11::string::end();
      std::
      for_each<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,sph_soln<FNV1A64x8>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Key,std::allocator<FNV1A64x8::Key>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Hash,std::allocator<FNV1A64x8::Hash>>const&)::_lambda(char&)_1_>
                (local_68,local_70);
      uVar7 = std::__cxx11::string::data();
      printf("%s=%u, ",uVar7,(ulong)(uint)identifier.field_2._8_4_);
      std::__cxx11::string::~string(local_60);
    }
    identifier.field_2._8_4_ = identifier.field_2._8_4_ + 1;
  }
  printf("};\n");
  local_90[0] = 0;
  pcVar8 = val_type<unsigned_long>(local_90);
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(hashes);
  printf("const %s Hash[ %lu ] = { ",pcVar8,sVar1);
  local_98 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(hashes);
  local_a0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(hashes);
  std::
  for_each<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,sph_soln<FNV1A64x8>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Key,std::allocator<FNV1A64x8::Key>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Hash,std::allocator<FNV1A64x8::Hash>>const&)::_lambda(unsigned_long_const&)_1_>
            (local_98,local_a0);
  printf("};\n");
  local_a3[0] = '\0';
  pcVar8 = val_type<unsigned_char>(local_a3);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(mixTable);
  printf("const %s Mixtable[ %lu ] = { ",pcVar8,sVar1);
  cVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(mixTable);
  cVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(mixTable);
  std::
  for_each<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,sph_soln<FNV1A64x8>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Key,std::allocator<FNV1A64x8::Key>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<FNV1A64x8::Hash,std::allocator<FNV1A64x8::Hash>>const&)::_lambda(unsigned_char_const&)_1_>
            (cVar9._M_current,cVar10._M_current);
  printf("};\n");
  printf("\n");
  return;
}

Assistant:

void sph_soln(const vector<string> &keywords, const vector<typename T::Key> &mixTable, const vector<string> &permutedKeywords, const vector<typename T::Hash> &hashes)
{
    printf("const char* Keyword[ %lu ] = { ", permutedKeywords.size());
    for_each(permutedKeywords.begin(), permutedKeywords.end(), [] (const string s) {
        if(s.length() > 0)
            printf("\"%s\", ", s.data());
        else
            printf("0, ");
    } );
    printf("};\n");

    printf("enum Key { ");
    for( uint pk = 0; pk < permutedKeywords.size(); pk++ )
        if(permutedKeywords[pk].length() > 0)
        {
            string identifier = permutedKeywords[ pk ];
            for_each(identifier.begin(), identifier.end(), [](string::value_type& c ) { c = toupper(c); } );
            printf("%s=%u, ", identifier.data(), pk);
        }
    printf("};\n");

    printf("const %s Hash[ %lu ] = { ", val_type(static_cast<typename T::Hash>(0)), hashes.size());
    for_each(hashes.begin(), hashes.end(), [] (const typename T::Hash & h) { cout << val_hex(h) << ", "; } );
    printf("};\n");

    printf("const %s Mixtable[ %lu ] = { ", val_type(static_cast<typename T::Key>(0)), mixTable.size());
    for_each(mixTable.begin(), mixTable.end(), [] (const typename T::Key & k) { cout << val_hex(k) << ", "; } );
    printf("};\n");
    printf("\n");
}